

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

void Abc_NtkMiterAddOne(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkMiter)

{
  Abc_Aig_t *pMan;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *p1;
  
  iVar1 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar1 != 0) {
    for (iVar1 = 0; iVar1 < pNtk->vObjs->nSize; iVar1 = iVar1 + 1) {
      pNode = Abc_NtkObj(pNtk,iVar1);
      if (pNode != (Abc_Obj_t *)0x0) {
        iVar2 = Abc_AigNodeIsAnd(pNode);
        if (iVar2 != 0) {
          pMan = (Abc_Aig_t *)pNtkMiter->pManFunc;
          pAVar3 = Abc_ObjChild0Copy(pNode);
          p1 = Abc_ObjChild1Copy(pNode);
          pAVar3 = Abc_AigAnd(pMan,pAVar3,p1);
          (pNode->field_6).pCopy = pAVar3;
        }
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMiter.c"
                ,0xee,"void Abc_NtkMiterAddOne(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkMiterAddOne( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkMiter )
{
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    Abc_AigForEachAnd( pNtk, pNode, i )
        pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}